

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O3

Test * CleanTestCleanRuleGenerator::Create(void)

{
  __node_base_ptr *pp_Var1;
  size_t *psVar2;
  size_type *psVar3;
  StateTestWithBuiltinRules *this;
  
  this = (StateTestWithBuiltinRules *)operator_new(0x268);
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(this);
  this[1].super_Test._vptr_Test = (_func_int **)&PTR__VirtualFileSystem_001d47a0;
  pp_Var1 = &this[1].state_.paths_._M_h._M_single_bucket;
  *(undefined4 *)&this[1].state_.paths_._M_h._M_single_bucket = 0;
  *(undefined8 *)&this[1].state_.pools_._M_t._M_impl = 0;
  this[1].super_Test.failed_ = false;
  *(undefined3 *)&this[1].super_Test.field_0x9 = 0;
  this[1].super_Test.assertion_failures_ = 0;
  this[1].state_.paths_._M_h._M_buckets = (__buckets_ptr)0x0;
  this[1].state_.paths_._M_h._M_bucket_count = 0;
  this[1].state_.paths_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  this[1].state_.paths_._M_h._M_element_count = 0;
  *(undefined8 *)&this[1].state_.paths_._M_h._M_rehash_policy = 0;
  *(__node_base_ptr **)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header = pp_Var1
  ;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pp_Var1;
  this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  psVar2 = &this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *(undefined4 *)&this[1].state_.pools_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)psVar2;
  this[1].state_.edges_.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)psVar2;
  this[1].state_.bindings_.super_RelPathEnv.super_Env._vptr_Env = (_func_int **)0x0;
  psVar3 = &this[1].state_.bindings_.super_RelPathEnv.rel_path_._M_string_length;
  *(undefined4 *)&this[1].state_.bindings_.super_RelPathEnv.rel_path_._M_string_length = 0;
  this[1].state_.bindings_.super_RelPathEnv.rel_path_.field_2._M_allocated_capacity = 0;
  *(size_type **)((long)&this[1].state_.bindings_.super_RelPathEnv.rel_path_.field_2 + 8) = psVar3;
  this[1].state_.bindings_.super_RelPathEnv.abs_path_._M_dataplus._M_p = (pointer)psVar3;
  this[1].state_.bindings_.super_RelPathEnv.abs_path_._M_string_length = 0;
  *(undefined4 *)&this[1].state_.bindings_.super_RelPathEnv.abs_path_.field_2 = 1;
  *(_Rb_tree_header **)((long)&this[1].state_.bindings_.super_RelPathEnv.abs_path_.field_2 + 8) =
       &this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&this[1].state_.bindings_.bindings_._M_t._M_impl = 0;
  *(undefined1 *)
   &this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(undefined4 *)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       0;
  *(undefined1 *)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x14) =
       0;
  *(_Base_ptr *)
   ((long)&this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       (_Base_ptr)0x100000001;
  this[1].state_.bindings_.bindings_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0x8000000000000000;
  *(undefined4 *)&this[1].state_.bindings_.rules_._M_t._M_impl = 0;
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CleanTest_001cfad8;
  g_current_test = (Test *)this;
  return &this->super_Test;
}

Assistant:

TEST_F(CleanTest, CleanRuleGenerator) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule regen\n"
"  command = cat $in > $out\n"
"  generator = 1\n"
"build out1: cat in1\n"
"build out2: regen in2\n"));
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(1, cleaner.cleaned_files_count());
  EXPECT_EQ(1u, fs_.files_removed_.size());

  fs_.Create("out1", "");

  EXPECT_EQ(0, cleaner.CleanAll(/*generator=*/true));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}